

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O1

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::verifyValidity
          (StateQueryMemoryWriteGuard<int[3]> *this,ResultCollector *result)

{
  ulong uVar1;
  ulong uVar2;
  string local_30;
  
  if ((char)this->m_preguard[0] == -0x22) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 0xb) break;
      uVar1 = uVar2 + 1;
    } while (*(char *)((long)this->m_preguard + uVar2 + 1) == -0x22);
    if (10 < uVar2) {
      if ((char)this->m_postguard[0] == -0x22) {
        uVar1 = 0;
        do {
          uVar2 = uVar1;
          if (uVar2 == 0xb) break;
          uVar1 = uVar2 + 1;
        } while (*(char *)((long)this->m_postguard + uVar2 + 1) == -0x22);
        if (10 < uVar2) {
          if ((char)this->m_value[0] != -0x22) {
            return true;
          }
          uVar1 = 0;
          do {
            uVar2 = uVar1;
            if (uVar2 == 0xb) break;
            uVar1 = uVar2 + 1;
          } while (*(char *)((long)this->m_value + uVar2 + 1) == -0x22);
          if (uVar2 < 0xb) {
            return true;
          }
          local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_30,"Get* did not return a value","");
          tcu::ResultCollector::fail(result,&local_30);
          goto LAB_01869505;
        }
      }
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"post-guard value was modified","");
      tcu::ResultCollector::fail(result,&local_30);
      goto LAB_01869505;
    }
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"pre-guard value was modified","");
  tcu::ResultCollector::fail(result,&local_30);
LAB_01869505:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::ResultCollector& result) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		result.fail("pre-guard value was modified");
		return false;
	}
	else if (isPostguardContaminated())
	{
		result.fail("post-guard value was modified");
		return false;
	}
	else if (isUndefined())
	{
		result.fail("Get* did not return a value");
		return false;
	}

	return true;
}